

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall
QPDFArgParser::addRequiredParameter
          (QPDFArgParser *this,string *arg,param_arg_handler_t *handler,char *parameter_name)

{
  char *pcVar1;
  OptionEntry *pOVar2;
  
  pOVar2 = registerArg(this,arg);
  pOVar2->parameter_needed = true;
  pcVar1 = (char *)(pOVar2->parameter_name)._M_string_length;
  strlen(parameter_name);
  std::__cxx11::string::_M_replace((ulong)&pOVar2->parameter_name,0,pcVar1,(ulong)parameter_name);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&pOVar2->param_arg_handler,handler);
  return;
}

Assistant:

void
QPDFArgParser::addRequiredParameter(
    std::string const& arg, param_arg_handler_t handler, char const* parameter_name)
{
    OptionEntry& oe = registerArg(arg);
    oe.parameter_needed = true;
    oe.parameter_name = parameter_name;
    oe.param_arg_handler = handler;
}